

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

uint __thiscall
polyscope::render::ManagedBuffer<unsigned_int>::getValue
          (ManagedBuffer<unsigned_int> *this,size_t ind)

{
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  CanonicalDataSource CVar6;
  uint32_t uVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  size_type *psVar11;
  size_t sVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong *local_108;
  uint local_100;
  undefined4 uStack_fc;
  ulong local_f8 [2];
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar6 = currentCanonicalDataSource(this);
  if (CVar6 != RenderBuffer) {
    if (CVar6 == NeedsCompute) {
      if ((this->computeFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
      if (ind < (ulong)((long)(this->data->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->data->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2)) goto LAB_002209e1;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
      puVar10 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar10) {
        local_b8 = *puVar10;
        lStack_b0 = puVar9[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar10;
        local_c8 = (ulong *)*puVar9;
      }
      local_c0 = puVar9[1];
      *puVar9 = puVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      cVar5 = '\x01';
      if (9 < ind) {
        sVar12 = ind;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          if (sVar12 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_00220856;
          }
          if (sVar12 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_00220856;
          }
          if (sVar12 < 10000) goto LAB_00220856;
          bVar3 = 99999 < sVar12;
          sVar12 = sVar12 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_00220856:
      local_108 = local_f8;
      std::__cxx11::string::_M_construct((ulong)&local_108,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
      uVar2 = CONCAT44(uStack_fc,local_100) + local_c0;
      uVar13 = 0xf;
      if (local_c8 != &local_b8) {
        uVar13 = local_b8;
      }
      if (uVar13 < uVar2) {
        uVar13 = 0xf;
        if (local_108 != local_f8) {
          uVar13 = local_f8[0];
        }
        if (uVar13 < uVar2) goto LAB_002208b8;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_002208b8:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
      }
      local_e8 = &local_d8;
      puVar1 = puVar9 + 2;
      if ((undefined8 *)*puVar9 == puVar1) {
        local_d8 = *puVar1;
        uStack_d0 = puVar9[3];
      }
      else {
        local_d8 = *puVar1;
        local_e8 = (undefined8 *)*puVar9;
      }
      local_e0 = puVar9[1];
      *puVar9 = puVar1;
      puVar9[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar15 = &local_68.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_68.field_2._M_allocated_capacity = *psVar11;
        local_68.field_2._8_8_ = plVar8[3];
        local_68._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar11;
        local_68._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_68._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      exception(&local_68);
      _Var14._M_p = local_68._M_dataplus._M_p;
    }
    else {
      if (CVar6 != HostData) {
        return 0;
      }
      if (ind < (ulong)((long)(this->data->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->data->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2)) goto LAB_002209e1;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar10 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar10) {
        local_b8 = *puVar10;
        lStack_b0 = plVar8[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar10;
        local_c8 = (ulong *)*plVar8;
      }
      local_c0 = plVar8[1];
      *plVar8 = (long)puVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      cVar5 = '\x01';
      if (9 < ind) {
        sVar12 = ind;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          if (sVar12 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_00220711;
          }
          if (sVar12 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_00220711;
          }
          if (sVar12 < 10000) goto LAB_00220711;
          bVar3 = 99999 < sVar12;
          sVar12 = sVar12 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_00220711:
      local_108 = local_f8;
      std::__cxx11::string::_M_construct((ulong)&local_108,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
      uVar2 = CONCAT44(uStack_fc,local_100) + local_c0;
      uVar13 = 0xf;
      if (local_c8 != &local_b8) {
        uVar13 = local_b8;
      }
      if (uVar13 < uVar2) {
        uVar13 = 0xf;
        if (local_108 != local_f8) {
          uVar13 = local_f8[0];
        }
        if (uVar13 < uVar2) goto LAB_00220773;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_00220773:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
      }
      local_e8 = &local_d8;
      puVar1 = puVar9 + 2;
      if ((undefined8 *)*puVar9 == puVar1) {
        local_d8 = *puVar1;
        uStack_d0 = puVar9[3];
      }
      else {
        local_d8 = *puVar1;
        local_e8 = (undefined8 *)*puVar9;
      }
      local_e0 = puVar9[1];
      *puVar9 = puVar1;
      puVar9[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar15 = &local_48.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_48.field_2._M_allocated_capacity = *psVar11;
        local_48.field_2._8_8_ = plVar8[3];
        local_48._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_48.field_2._M_allocated_capacity = *psVar11;
        local_48._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_48._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      exception(&local_48);
      _Var14._M_p = local_48._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var14._M_p != paVar15) {
      operator_delete(_Var14._M_p);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
LAB_002209e1:
    return (this->data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[ind];
  }
  if ((long)ind <
      ((this->renderAttributeBuffer).
       super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      dataSize) goto LAB_002206fe;
  std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_b8 = *puVar10;
    lStack_b0 = plVar8[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar10;
    local_c8 = (ulong *)*plVar8;
  }
  local_c0 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar5 = '\x01';
  if (9 < ind) {
    sVar12 = ind;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (sVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00220573;
      }
      if (sVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00220573;
      }
      if (sVar12 < 10000) goto LAB_00220573;
      bVar3 = 99999 < sVar12;
      sVar12 = sVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00220573:
  local_108 = local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
  uVar2 = CONCAT44(uStack_fc,local_100) + local_c0;
  uVar13 = 0xf;
  if (local_c8 != &local_b8) {
    uVar13 = local_b8;
  }
  if (uVar13 < uVar2) {
    uVar13 = 0xf;
    if (local_108 != local_f8) {
      uVar13 = local_f8[0];
    }
    if (uVar13 < uVar2) goto LAB_002205d5;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_002205d5:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
  }
  local_e8 = &local_d8;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_d8 = *puVar1;
    uStack_d0 = puVar9[3];
  }
  else {
    local_d8 = *puVar1;
    local_e8 = (undefined8 *)*puVar9;
  }
  local_e0 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_88.field_2._M_allocated_capacity = *psVar11;
    local_88.field_2._8_8_ = plVar8[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar11;
    local_88._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_88._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  exception(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
LAB_002206fe:
  uVar7 = getAttributeBufferData<unsigned_int>
                    ((this->renderAttributeBuffer).
                     super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,ind);
  return uVar7;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}